

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

common_control_vector_data *
common_control_vector_load
          (vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
           *load_infos)

{
  float fVar1;
  bool bVar2;
  undefined8 uVar3;
  value_type_conflict6 *__x;
  size_type sVar4;
  reference pvVar5;
  common_log *log;
  common_control_vector_data *in_RDI;
  size_t i;
  common_control_vector_data cur;
  common_control_vector_load_info *info;
  const_iterator __end1;
  const_iterator __begin1;
  vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
  *__range1;
  common_control_vector_data *result;
  common_control_vector_data *in_stack_ffffffffffffff28;
  common_control_vector_data *in_stack_ffffffffffffff30;
  common_log *in_stack_ffffffffffffff58;
  common_control_vector_data *this;
  ulong local_88;
  size_type local_78;
  size_type local_70;
  int local_68;
  int local_58;
  vector<float,_std::allocator<float>_> local_50;
  reference local_38;
  common_control_vector_load_info *local_30;
  __normal_iterator<const_common_control_vector_load_info_*,_std::vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  in_RDI->n_embd = -1;
  this = in_RDI;
  memset(&in_RDI->data,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x32c331);
  local_28[0]._M_current =
       (common_control_vector_load_info *)
       std::
       vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>::
       begin((vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
              *)in_stack_ffffffffffffff28);
  local_30 = (common_control_vector_load_info *)
             std::
             vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
             ::end((vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
                    *)in_stack_ffffffffffffff28);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_common_control_vector_load_info_*,_std::vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<const_common_control_vector_load_info_*,_std::vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>_>
                             *)in_stack_ffffffffffffff28), bVar2) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_common_control_vector_load_info_*,_std::vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>_>
               ::operator*(local_28);
    common_control_vector_load_one((common_control_vector_load_info *)load_infos);
    if (local_58 == -1) {
      this->n_embd = -1;
      local_68 = 2;
    }
    else if ((this->n_embd == -1) || (this->n_embd == local_58)) {
      if (this->n_embd == -1) {
        common_control_vector_data::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      else {
        local_70 = std::vector<float,_std::allocator<float>_>::size(&this->data);
        local_78 = std::vector<float,_std::allocator<float>_>::size(&local_50);
        __x = (value_type_conflict6 *)std::max<unsigned_long>(&local_70,&local_78);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)this,
                   (size_type)in_stack_ffffffffffffff58,__x);
        for (local_88 = 0; sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_50),
            local_88 < sVar4; local_88 = local_88 + 1) {
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,local_88);
          fVar1 = *pvVar5;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&this->data,local_88);
          *pvVar5 = fVar1 + *pvVar5;
        }
      }
      local_68 = 0;
    }
    else {
      if (-1 < common_log_verbosity_thold) {
        in_stack_ffffffffffffff58 = common_log_main();
        uVar3 = std::__cxx11::string::c_str();
        common_log_add(in_stack_ffffffffffffff58,GGML_LOG_LEVEL_ERROR,
                       "%s: control vectors in %s does not match previous dimensions\n",
                       "common_control_vector_load",uVar3);
      }
      this->n_embd = -1;
      local_68 = 2;
    }
    common_control_vector_data::~common_control_vector_data((common_control_vector_data *)0x32c5b5);
    if (local_68 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_common_control_vector_load_info_*,_std::vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>_>
    ::operator++(local_28);
  }
  if (this->n_embd == -1) {
    if (-1 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: no valid control vector files passed\n",
                     "common_control_vector_load");
    }
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x32c62f);
  }
  return in_RDI;
}

Assistant:

common_control_vector_data common_control_vector_load(const std::vector<common_control_vector_load_info> & load_infos) {
    common_control_vector_data result = { -1, {} };

    for (const auto & info : load_infos) {
        auto cur = common_control_vector_load_one(info);

        if (cur.n_embd == -1) {
            result.n_embd = -1;
            break;
        }
        if (result.n_embd != -1 && result.n_embd != cur.n_embd) {
            LOG_ERR("%s: control vectors in %s does not match previous dimensions\n", __func__, info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        if (result.n_embd == -1) {
            result = std::move(cur);
        } else {
            result.data.resize(std::max(result.data.size(), cur.data.size()), 0.0f);  // extend if necessary
            for (size_t i = 0; i < cur.data.size(); i++) {
                result.data[i] += cur.data[i];
            }
        }
    }

    if (result.n_embd == -1) {
        LOG_ERR("%s: no valid control vector files passed\n", __func__);
        result.data.clear();
    }

    return result;
}